

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O3

int32_t ucnv_getCCSID_63(UConverter *converter,UErrorCode *err)

{
  UConverterGetName p_Var1;
  char *pcVar2;
  long lVar3;
  UConverterStaticData *pUVar4;
  int32_t iVar5;
  
  if (U_ZERO_ERROR < *err) {
    return -1;
  }
  pUVar4 = converter->sharedData->staticData;
  if (pUVar4->codepage != 0) {
    return pUVar4->codepage;
  }
  p_Var1 = converter->sharedData->impl->getName;
  if (p_Var1 != (UConverterGetName)0x0) {
    pcVar2 = (*p_Var1)(converter);
    if (pcVar2 != (char *)0x0) goto LAB_00331888;
    pUVar4 = converter->sharedData->staticData;
  }
  pcVar2 = pUVar4->name;
LAB_00331888:
  pcVar2 = ucnv_getStandardName_63(pcVar2,"IBM",err);
  iVar5 = 0;
  if (((*err < U_ILLEGAL_ARGUMENT_ERROR) && (pcVar2 != (char *)0x0)) &&
     (pcVar2 = strchr(pcVar2,0x2d), pcVar2 != (char *)0x0)) {
    lVar3 = atol(pcVar2 + 1);
    iVar5 = (int32_t)lVar3;
  }
  return iVar5;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_getCCSID(const UConverter * converter,
              UErrorCode * err)
{
    int32_t ccsid;
    if (U_FAILURE (*err))
        return -1;

    ccsid = converter->sharedData->staticData->codepage;
    if (ccsid == 0) {
        /* Rare case. This is for cases like gb18030,
        which doesn't have an IBM canonical name, but does have an IBM alias. */
        const char *standardName = ucnv_getStandardName(ucnv_getName(converter, err), "IBM", err);
        if (U_SUCCESS(*err) && standardName) {
            const char *ccsidStr = uprv_strchr(standardName, '-');
            if (ccsidStr) {
                ccsid = (int32_t)atol(ccsidStr+1);  /* +1 to skip '-' */
            }
        }
    }
    return ccsid;
}